

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

void Abc_NodeMffcConeSuppPrint(Abc_Obj_t *pNode)

{
  Vec_Ptr_t *vCone;
  void **ppvVar1;
  Vec_Ptr_t *vSupp;
  char *pcVar2;
  long lVar3;
  
  vCone = (Vec_Ptr_t *)malloc(0x10);
  vCone->nCap = 100;
  vCone->nSize = 0;
  ppvVar1 = (void **)malloc(800);
  vCone->pArray = ppvVar1;
  vSupp = (Vec_Ptr_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  ppvVar1 = (void **)malloc(800);
  vSupp->pArray = ppvVar1;
  Abc_NodeDeref_rec(pNode);
  Abc_NodeMffcConeSupp(pNode,vCone,vSupp);
  Abc_NodeRef_rec(pNode);
  pcVar2 = Abc_ObjName(pNode);
  printf("Node = %6s : Supp = %3d  Cone = %3d  (",pcVar2,(ulong)(uint)vSupp->nSize,
         (ulong)(uint)vCone->nSize);
  if (0 < vCone->nSize) {
    lVar3 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)vCone->pArray[lVar3]);
      printf(" %s",pcVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCone->nSize);
  }
  puts(" )");
  if (vCone->pArray != (void **)0x0) {
    free(vCone->pArray);
    vCone->pArray = (void **)0x0;
  }
  free(vCone);
  if (vSupp->pArray != (void **)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (void **)0x0;
  }
  free(vSupp);
  return;
}

Assistant:

void Abc_NodeMffcConeSuppPrint( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vCone, * vSupp;
    Abc_Obj_t * pObj;
    int i;
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    printf( "Node = %6s : Supp = %3d  Cone = %3d  (", 
        Abc_ObjName(pNode), Vec_PtrSize(vSupp), Vec_PtrSize(vCone) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
        printf( " %s", Abc_ObjName(pObj) );
    printf( " )\n" );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );
}